

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  ostream *poVar22;
  string *psVar23;
  iterator iVar24;
  FILE *__s;
  FILE *pFVar25;
  size_t sVar26;
  size_t sVar27;
  pointer pbVar28;
  ulong uVar29;
  ulong uVar30;
  _Alloc_hider _Var31;
  allocator local_23c5;
  int retval;
  FILE *local_23c0;
  char *local_23b8;
  allocator local_23a9;
  string topLevelString;
  string outputFileName;
  string cmd;
  string output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arFiles;
  string md5filename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirs;
  string dirName;
  uint local_2278;
  char *local_2268;
  __time_t local_2240;
  string compression_suffix;
  string cmake_tar;
  string compression_modifier;
  string ctlfilename;
  string dbfilename;
  string debian_pkg_name;
  cmGeneratedFileStream out;
  
  dbfilename._M_dataplus._M_p = (pointer)&dbfilename.field_2;
  dbfilename._M_string_length = 0;
  dbfilename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::append((char *)&dbfilename);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::append((char *)&dbfilename);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,dbfilename._M_dataplus._M_p,false);
  std::operator<<((ostream *)&out,"2.0");
  std::endl<char,std::char_traits<char>>((ostream *)&out);
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  ctlfilename._M_dataplus._M_p = (pointer)&ctlfilename.field_2;
  ctlfilename._M_string_length = 0;
  ctlfilename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::assign((char *)&ctlfilename);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::append((char *)&ctlfilename);
  std::__cxx11::string::string
            ((string *)&dirName,"GEN_CPACK_DEBIAN_PACKAGE_NAME",(allocator *)&installDirs);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar8,(allocator *)&cmd);
  cmsys::SystemTools::LowerCase(&debian_pkg_name,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&dirName);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",(allocator *)&dirName);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SECTION",(allocator *)&dirName);
  pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY",(allocator *)&dirName);
  pcVar10 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",(allocator *)&dirName);
  pcVar11 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",(allocator *)&dirName);
  pcVar12 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION",(allocator *)&dirName);
  pcVar13 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS",(allocator *)&dirName);
  pcVar14 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS",(allocator *)&dirName);
  pcVar15 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS",(allocator *)&dirName);
  pcVar16 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE",(allocator *)&dirName);
  pcVar17 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS",(allocator *)&dirName);
  pcVar18 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES",(allocator *)&dirName);
  local_23c0 = (FILE *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS",(allocator *)&dirName);
  local_23b8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS",(allocator *)&dirName);
  pcVar19 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES",(allocator *)&dirName);
  pcVar20 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES",(allocator *)&dirName);
  pcVar21 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,ctlfilename._M_dataplus._M_p,false);
  poVar22 = std::operator<<((ostream *)&out,"Package: ");
  poVar22 = std::operator<<(poVar22,(string *)&debian_pkg_name);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&out,"Version: ");
  poVar22 = std::operator<<(poVar22,pcVar8);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&out,"Section: ");
  poVar22 = std::operator<<(poVar22,pcVar9);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&out,"Priority: ");
  poVar22 = std::operator<<(poVar22,pcVar10);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&out,"Architecture: ");
  poVar22 = std::operator<<(poVar22,pcVar11);
  std::operator<<(poVar22,"\n");
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Depends: ");
    poVar22 = std::operator<<(poVar22,pcVar14);
    std::operator<<(poVar22,"\n");
  }
  if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Recommends: ");
    poVar22 = std::operator<<(poVar22,pcVar15);
    std::operator<<(poVar22,"\n");
  }
  if ((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Suggests: ");
    poVar22 = std::operator<<(poVar22,pcVar16);
    std::operator<<(poVar22,"\n");
  }
  if ((pcVar17 != (char *)0x0) && (*pcVar17 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Homepage: ");
    poVar22 = std::operator<<(poVar22,pcVar17);
    std::operator<<(poVar22,"\n");
  }
  if ((pcVar18 != (char *)0x0) && (*pcVar18 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Pre-Depends: ");
    poVar22 = std::operator<<(poVar22,pcVar18);
    std::operator<<(poVar22,"\n");
  }
  if ((local_23c0 != (FILE *)0x0) && (*(char *)local_23c0 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Enhances: ");
    poVar22 = std::operator<<(poVar22,(char *)local_23c0);
    std::operator<<(poVar22,"\n");
  }
  if ((local_23b8 != (char *)0x0) && (*local_23b8 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Breaks: ");
    poVar22 = std::operator<<(poVar22,local_23b8);
    std::operator<<(poVar22,"\n");
  }
  if ((pcVar19 != (char *)0x0) && (*pcVar19 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Conflicts: ");
    poVar22 = std::operator<<(poVar22,pcVar19);
    std::operator<<(poVar22,"\n");
  }
  if ((pcVar20 != (char *)0x0) && (*pcVar20 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Provides: ");
    poVar22 = std::operator<<(poVar22,pcVar20);
    std::operator<<(poVar22,"\n");
  }
  if ((pcVar21 != (char *)0x0) && (*pcVar21 != '\0')) {
    poVar22 = std::operator<<((ostream *)&out,"Replaces: ");
    poVar22 = std::operator<<(poVar22,pcVar21);
    std::operator<<(poVar22,"\n");
  }
  std::__cxx11::string::string((string *)&installDirs,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&cmd)
  ;
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&installDirs);
  std::__cxx11::string::string((string *)&dirName,pcVar8,(allocator *)&cmake_tar);
  std::__cxx11::string::~string((string *)&installDirs);
  std::__cxx11::string::push_back((char)&dirName);
  for (pbVar28 = (this->packageFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar28 !=
      (this->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar28 = pbVar28 + 1) {
    cmsys::SystemTools::FileLength(pbVar28);
  }
  std::__cxx11::string::~string((string *)&dirName);
  poVar22 = std::operator<<((ostream *)&out,"Installed-Size: ");
  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&out,"Maintainer: ");
  poVar22 = std::operator<<(poVar22,pcVar12);
  std::operator<<(poVar22,"\n");
  poVar22 = std::operator<<((ostream *)&out,"Description: ");
  poVar22 = std::operator<<(poVar22,pcVar13);
  std::operator<<(poVar22,"\n");
  std::endl<char,std::char_traits<char>>((ostream *)&out);
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE",(allocator *)&dirName);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::string((string *)&cmd,pcVar8,(allocator *)&installDirs);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",(allocator *)&dirName);
  pcVar9 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  pcVar8 = "gzip";
  if (pcVar9 != (char *)0x0) {
    pcVar8 = pcVar9;
  }
  std::__cxx11::string::string((string *)&cmake_tar," ",(allocator *)&out);
  std::__cxx11::string::string((string *)&compression_modifier,"a",(allocator *)&out);
  compression_suffix._M_dataplus._M_p = (pointer)&compression_suffix.field_2;
  compression_suffix._M_string_length = 0;
  compression_suffix.field_2._M_local_buf[0] = '\0';
  iVar6 = strcmp(pcVar8,"lzma");
  if ((iVar6 == 0) || (((*pcVar8 == 'x' && (pcVar8[1] == 'z')) && (pcVar8[2] == '\0')))) {
    std::__cxx11::string::assign((char *)&compression_suffix);
  }
  else {
    iVar6 = strcmp(pcVar8,"bzip2");
    if (iVar6 == 0) {
      std::__cxx11::string::assign((char *)&compression_suffix);
      std::__cxx11::string::assign((char *)&compression_modifier);
      psVar23 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::operator+(&dirName,"\"",psVar23);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                     &dirName,"\" -E ");
      std::__cxx11::string::append((string *)&cmake_tar);
    }
    else {
      iVar6 = strcmp(pcVar8,"gzip");
      if (iVar6 == 0) {
        std::__cxx11::string::assign((char *)&compression_suffix);
        std::__cxx11::string::assign((char *)&compression_modifier);
        psVar23 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::operator+(&dirName,"\"",psVar23);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       &dirName,"\" -E ");
        std::__cxx11::string::append((string *)&cmake_tar);
      }
      else {
        iVar6 = strcmp(pcVar8,"none");
        if (iVar6 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
          poVar22 = std::operator<<((ostream *)&out,"Error unrecognized compression type: ");
          poVar22 = std::operator<<(poVar22,pcVar8);
          std::endl<char,std::char_traits<char>>(poVar22);
          pcVar1 = (this->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                          ,0x1b1,dirName._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&dirName);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
          goto LAB_0028da83;
        }
        std::__cxx11::string::assign((char *)&compression_suffix);
        std::__cxx11::string::assign((char *)&compression_modifier);
        psVar23 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::operator+(&dirName,"\"",psVar23);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                       &dirName,"\" -E ");
        std::__cxx11::string::append((string *)&cmake_tar);
      }
    }
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&dirName);
  }
LAB_0028da83:
  std::operator+(&output,&cmake_tar,"tar c");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&installDirs,
                 &output,&compression_modifier);
  std::operator+(&dirName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &installDirs,"f data.tar");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,&dirName,
                 &compression_suffix);
  std::__cxx11::string::append((string *)&cmd);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&dirName);
  std::__cxx11::string::~string((string *)&installDirs);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::string((string *)&dirName,"GEN_WDIR",(allocator *)&installDirs);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&out,pcVar8,(allocator *)&output);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&dirName);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  poVar22 = std::operator<<((ostream *)&out,"WDIR: \"");
  std::__cxx11::string::string((string *)&dirName,"GEN_WDIR",(allocator *)&installDirs);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&dirName);
  poVar22 = std::operator<<(poVar22,pcVar8);
  poVar22 = std::operator<<(poVar22,"\", length = ");
  poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
  std::endl<char,std::char_traits<char>>(poVar22);
  std::__cxx11::string::~string((string *)&dirName);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x1be,dirName._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&dirName);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &installDirs._M_t._M_impl.super__Rb_tree_header._M_header;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  installDirs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_23c0 = (FILE *)(out.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                       + 1);
  installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       installDirs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pbVar28 = (this->packageFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; _Var31._M_p = cmd._M_dataplus._M_p,
      pbVar28 !=
      (this->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar28 = pbVar28 + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
    poVar22 = std::operator<<((ostream *)&out,"FILEIT: \"");
    poVar22 = std::operator<<(poVar22,(string *)pbVar28);
    poVar22 = std::operator<<(poVar22,"\"");
    std::endl<char,std::char_traits<char>>(poVar22);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1c5,dirName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&dirName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
    std::__cxx11::string::find((char)pbVar28,0x2f);
    std::__cxx11::string::substr((ulong)&dirName,(ulong)pbVar28);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
    poVar22 = std::operator<<((ostream *)&out,"RELATIVEDIR: \"");
    poVar22 = std::operator<<(poVar22,(string *)&dirName);
    poVar22 = std::operator<<(poVar22,"\"");
    std::endl<char,std::char_traits<char>>(poVar22);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1ca,output._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&output);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
    iVar24 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&installDirs._M_t,&dirName);
    if ((_Rb_tree_header *)iVar24._M_node == &installDirs._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&installDirs,&dirName);
      std::__cxx11::string::append((char *)&cmd);
      std::__cxx11::string::append((string *)&cmd);
    }
    std::__cxx11::string::~string((string *)&dirName);
  }
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  retval = -1;
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  bVar5 = cmSystemTools::RunSingleCommand
                    (_Var31._M_p,&output,&output,&retval,pcVar8,
                     (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
  std::__cxx11::string::~string((string *)&out);
  if (!bVar5 || retval != 0) {
    std::__cxx11::string::string((string *)&out,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&dirName);
    pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&md5filename,pcVar8,(allocator *)&topLevelString);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::append((char *)&md5filename);
    cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
    poVar22 = std::operator<<((ostream *)&out,"# Run command: ");
    poVar22 = std::operator<<(poVar22,(string *)&cmd);
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,"# Working directory: ");
    poVar22 = std::operator<<(poVar22,(string *)&(this->super_cmCPackGenerator).toplevel);
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,"# Output:");
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,(string *)&output);
    std::endl<char,std::char_traits<char>>(poVar22);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    poVar22 = std::operator<<((ostream *)&dirName,"Problem running tar command: ");
    poVar22 = std::operator<<(poVar22,(string *)&cmd);
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,"Please check ");
    poVar22 = std::operator<<(poVar22,(string *)&md5filename);
    poVar22 = std::operator<<(poVar22," for errors");
    std::endl<char,std::char_traits<char>>(poVar22);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1e3,topLevelString._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&topLevelString);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    std::__cxx11::string::~string((string *)&md5filename);
    iVar6 = 0;
    goto LAB_0028edb7;
  }
  md5filename._M_dataplus._M_p = (pointer)&md5filename.field_2;
  md5filename._M_string_length = 0;
  md5filename.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::assign((char *)&md5filename);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::append((char *)&md5filename);
  cmGeneratedFileStream::cmGeneratedFileStream(&out,md5filename._M_dataplus._M_p,false);
  std::__cxx11::string::string
            ((string *)&dirName,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&outputFileName);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&dirName);
  std::__cxx11::string::string((string *)&topLevelString,pcVar8,(allocator *)&arFiles);
  std::__cxx11::string::~string((string *)&dirName);
  std::__cxx11::string::push_back((char)&topLevelString);
  local_23c0 = (FILE *)&(this->super_cmCPackGenerator).toplevel;
  for (pbVar28 = (this->packageFiles).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pbVar28 !=
      (this->packageFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar28 = pbVar28 + 1) {
    std::__cxx11::string::assign((char *)&cmd);
    cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::append((string *)&cmd);
    std::__cxx11::string::append((char *)&cmd);
    std::__cxx11::string::append((string *)&cmd);
    std::__cxx11::string::append((char *)&cmd);
    bVar5 = cmSystemTools::RunSingleCommand
                      (cmd._M_dataplus._M_p,&output,&output,&retval,
                       (this->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                       (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
    if (!bVar5 || retval != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
      poVar22 = std::operator<<((ostream *)&dirName,"Problem running cmake -E md5sum ");
      poVar22 = std::operator<<(poVar22,(string *)&cmd);
      std::endl<char,std::char_traits<char>>(poVar22);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x201,outputFileName._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&outputFileName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    }
    cmsys::SystemTools::ReplaceString(&output,topLevelString._M_dataplus._M_p,"");
    std::operator<<((ostream *)&out,(string *)&output);
  }
  std::__cxx11::string::~string((string *)&topLevelString);
  cmGeneratedFileStream::~cmGeneratedFileStream(&out);
  cmsys::SystemTools::SetPermissions(md5filename._M_dataplus._M_p,0x1a4);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE",(allocator *)&dirName);
  cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::assign((char *)&cmd);
  std::__cxx11::string::~string((string *)&out);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &cmake_tar,"tar czf control.tar.gz ./control ./md5sums");
  std::__cxx11::string::append((string *)&cmd);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string
            ((string *)&out,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA",(allocator *)&dirName);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  if (pcVar8 != (char *)0x0) {
    outputFileName._M_dataplus._M_p = (pointer)0x0;
    outputFileName._M_string_length = 0;
    outputFileName.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&out,pcVar8,(allocator *)&dirName);
    cmSystemTools::ExpandListArgument
              ((string *)&out,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&outputFileName,false);
    std::__cxx11::string::~string((string *)&out);
    for (_Var31 = outputFileName._M_dataplus;
        _Var31._M_p != (pointer)outputFileName._M_string_length; _Var31._M_p = _Var31._M_p + 0x20) {
      cmsys::SystemTools::GetFilenameName((string *)&out,(string *)_Var31._M_p);
      std::__cxx11::string::string((string *)&topLevelString,"GEN_WDIR",(allocator *)&arFiles);
      pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&topLevelString);
      std::__cxx11::string::string((string *)&dirName,pcVar8,&local_23c5);
      std::__cxx11::string::~string((string *)&topLevelString);
      std::__cxx11::string::append((char *)&dirName);
      std::__cxx11::string::append((string *)&dirName);
      bVar5 = cmsys::SystemTools::CopyFileIfDifferent((string *)_Var31._M_p,&dirName);
      if (bVar5) {
        std::__cxx11::string::append((char *)&cmd);
        std::__cxx11::string::append((string *)&cmd);
      }
      std::__cxx11::string::~string((string *)&dirName);
      std::__cxx11::string::~string((string *)&out);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&outputFileName);
  }
  std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
  pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
  bVar5 = cmSystemTools::RunSingleCommand
                    (cmd._M_dataplus._M_p,&output,&output,&retval,pcVar8,
                     (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
  std::__cxx11::string::~string((string *)&out);
  if (bVar5 && retval == 0) {
    arFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    arFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    arFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&out,"GEN_WDIR",(allocator *)&dirName);
    pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&topLevelString,pcVar8,(allocator *)&outputFileName);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::append((char *)&topLevelString);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                   &topLevelString,"debian-binary");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                   &topLevelString,"control.tar.gz");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::operator+(&dirName,&topLevelString,"data.tar");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                   &dirName,&compression_suffix);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::~string((string *)&dirName);
    std::__cxx11::string::string((string *)&out,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&dirName);
    pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&outputFileName,pcVar8,&local_23c5);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::append((char *)&outputFileName);
    std::__cxx11::string::string((string *)&out,"CPACK_OUTPUT_FILE_NAME",(allocator *)&dirName);
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::append((char *)&outputFileName);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::string
              ((string *)&out,outputFileName._M_dataplus._M_p,(allocator *)&dirName);
    __s = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"wb+");
    std::__cxx11::string::~string((string *)&out);
    if (__s == (FILE *)0x0) {
      iVar6 = -4;
LAB_0028ecca:
      std::__cxx11::string::string((string *)&out,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",&local_23c5);
      pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
      std::__cxx11::string::string((string *)&dirName,pcVar8,&local_23a9);
      std::__cxx11::string::~string((string *)&out);
      std::__cxx11::string::append((char *)&dirName);
      cmGeneratedFileStream::cmGeneratedFileStream(&out,dirName._M_dataplus._M_p,false);
      poVar22 = std::operator<<((ostream *)&out,"# Problem creating archive using: ");
      poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar6);
      std::endl<char,std::char_traits<char>>(poVar22);
      cmGeneratedFileStream::~cmGeneratedFileStream(&out);
      std::__cxx11::string::~string((string *)&dirName);
      iVar6 = 0;
    }
    else {
      fwrite("!<arch>\n",8,1,__s);
      iVar6 = fseek(__s,0,2);
      if (iVar6 == -1) {
        iVar6 = -3;
      }
      else {
        iVar6 = 0;
        for (pbVar28 = arFiles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pbVar28 !=
            arFiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; pbVar28 = pbVar28 + 1) {
          pcVar8 = (pbVar28->_M_dataplus)._M_p;
          std::__cxx11::string::string((string *)&out,pcVar8,&local_23c5);
          pFVar25 = (FILE *)cmsys::SystemTools::Fopen((string *)&out,"rb");
          std::__cxx11::string::~string((string *)&out);
          iVar7 = -1;
          if (pFVar25 != (FILE *)0x0) {
            local_23c0 = pFVar25;
            pcVar10 = strrchr(pcVar8,0x2f);
            pcVar9 = pcVar10 + 1;
            if (pcVar10 == (char *)0x0) {
              pcVar9 = pcVar8;
            }
            stat64(pcVar8,(stat64 *)&dirName);
            sVar26 = strlen(pcVar9);
            uVar2 = dirName.field_2._12_4_;
            if (0xfffe < (uint)dirName.field_2._12_4_) {
              uVar2 = 0xffff;
            }
            uVar3 = local_2278;
            if (0xfffe < local_2278) {
              uVar3 = 0xffff;
            }
            if ((sVar26 < 0x11) && (pcVar8 = strchr(pcVar9,0x20), pcVar8 == (char *)0x0)) {
              local_23b8 = local_2268;
              sprintf(ar_hb,"%-16.16s%-12ld%-6u%-6u%-8o%-10lld%2s",pcVar9,local_2240,
                      (ulong)(uint)uVar2,(ulong)uVar3,(ulong)(uint)dirName.field_2._8_4_,local_2268,
                      "`\n");
              sVar26 = 0;
            }
            else {
              local_23b8 = local_2268;
              sprintf(ar_hb,"%s%-13d%-12ld%-6u%-6u%-8o%-10lld%2s","#1/",sVar26 & 0xffffffff,
                      local_2240,(ulong)(uint)uVar2,(ulong)uVar3,(ulong)(uint)dirName.field_2._8_4_,
                      local_2268 + sVar26,"`\n");
            }
            sVar27 = fwrite(ar_hb,1,0x3c,__s);
            if ((sVar27 != 0x3c) ||
               ((sVar4 = ar_already_written, sVar26 != 0 &&
                (sVar27 = fwrite(pcVar9,1,sVar26,__s), sVar4 = sVar26, sVar27 != sVar26)))) {
LAB_0028ec9d:
              fclose(local_23c0);
              iVar6 = -2;
              break;
            }
            ar_already_written = sVar4;
            pcVar8 = local_23b8;
            if (local_23b8 != (char *)0x0) {
              while (pcVar8 != (char *)0x0) {
                pcVar9 = (char *)0x2000;
                if ((long)pcVar8 < 0x2000) {
                  pcVar9 = pcVar8;
                }
                sVar26 = fread(&out,1,(size_t)pcVar9,local_23c0);
                if (sVar26 == 0) goto LAB_0028ec95;
                pcVar8 = pcVar8 + -sVar26;
                for (uVar30 = 0; uVar29 = sVar26 - uVar30, uVar30 <= sVar26 && uVar29 != 0;
                    uVar30 = uVar30 + sVar27) {
                  sVar27 = fwrite((void *)((long)&out.super_ofstream.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar30),1,sVar26,__s);
                  if (sVar27 < sVar26) goto LAB_0028ec95;
                  sVar26 = uVar29;
                }
              }
              if ((((int)local_23b8 + (int)ar_already_written & 1U) != 0) &&
                 (sVar26 = fwrite(&copy_ar(CF*,long)::pad,1,1,__s), sVar26 != 1)) {
LAB_0028ec95:
                ar_already_written = 0;
                goto LAB_0028ec9d;
              }
            }
            ar_already_written = 0;
            fclose(local_23c0);
            iVar7 = iVar6;
          }
          iVar6 = iVar7;
        }
      }
      fclose(__s);
      if (iVar6 != 0) goto LAB_0028ecca;
      iVar6 = 1;
    }
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__cxx11::string::~string((string *)&topLevelString);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&arFiles);
  }
  else {
    std::__cxx11::string::string((string *)&out,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&dirName);
    pcVar8 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&out);
    std::__cxx11::string::string((string *)&topLevelString,pcVar8,(allocator *)&outputFileName);
    std::__cxx11::string::~string((string *)&out);
    std::__cxx11::string::append((char *)&topLevelString);
    cmGeneratedFileStream::cmGeneratedFileStream(&out,topLevelString._M_dataplus._M_p,false);
    poVar22 = std::operator<<((ostream *)&out,"# Run command: ");
    poVar22 = std::operator<<(poVar22,(string *)&cmd);
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,"# Working directory: ");
    poVar22 = std::operator<<(poVar22,(string *)local_23c0);
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,"# Output:");
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,(string *)&output);
    std::endl<char,std::char_traits<char>>(poVar22);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirName);
    poVar22 = std::operator<<((ostream *)&dirName,"Problem running tar command: ");
    poVar22 = std::operator<<(poVar22,(string *)&cmd);
    poVar22 = std::endl<char,std::char_traits<char>>(poVar22);
    poVar22 = std::operator<<(poVar22,"Please check ");
    poVar22 = std::operator<<(poVar22,(string *)&topLevelString);
    poVar22 = std::operator<<(poVar22," for errors");
    std::endl<char,std::char_traits<char>>(poVar22);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x23b,outputFileName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&outputFileName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirName);
    cmGeneratedFileStream::~cmGeneratedFileStream(&out);
    std::__cxx11::string::~string((string *)&topLevelString);
    iVar6 = 0;
  }
  std::__cxx11::string::~string((string *)&md5filename);
LAB_0028edb7:
  std::__cxx11::string::~string((string *)&output);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&installDirs._M_t);
  std::__cxx11::string::~string((string *)&compression_suffix);
  std::__cxx11::string::~string((string *)&compression_modifier);
  std::__cxx11::string::~string((string *)&cmake_tar);
  std::__cxx11::string::~string((string *)&cmd);
  std::__cxx11::string::~string((string *)&debian_pkg_name);
  std::__cxx11::string::~string((string *)&ctlfilename);
  std::__cxx11::string::~string((string *)&dbfilename);
  return iVar6;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  // debian-binary file
  std::string dbfilename;
    dbfilename += this->GetOption("GEN_WDIR");
  dbfilename += "/debian-binary";
    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(dbfilename.c_str());
    out << "2.0";
    out << std::endl; // required for valid debian package
    }

  // control file
  std::string ctlfilename;
    ctlfilename = this->GetOption("GEN_WDIR");
  ctlfilename += "/control";

  // debian policy enforce lower case for package name
  // mandatory entries:
  std::string debian_pkg_name = cmsys::SystemTools::LowerCase(
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") );
  const char* debian_pkg_version =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  const char* debian_pkg_section =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  const char* debian_pkg_priority =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  const char* debian_pkg_arch =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  const char* maintainer =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  const char* desc =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  // optional entries
  const char* debian_pkg_dep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  const char* debian_pkg_rec =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  const char* debian_pkg_sug =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  const char* debian_pkg_url =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  const char* debian_pkg_predep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  const char* debian_pkg_enhances =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  const char* debian_pkg_breaks =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  const char* debian_pkg_conflicts =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  const char* debian_pkg_provides =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  const char* debian_pkg_replaces =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(ctlfilename.c_str());
    out << "Package: " << debian_pkg_name << "\n";
    out << "Version: " << debian_pkg_version << "\n";
    out << "Section: " << debian_pkg_section << "\n";
    out << "Priority: " << debian_pkg_priority << "\n";
    out << "Architecture: " << debian_pkg_arch << "\n";
    if(debian_pkg_dep && *debian_pkg_dep)
      {
      out << "Depends: " << debian_pkg_dep << "\n";
      }
    if(debian_pkg_rec && *debian_pkg_rec)
      {
      out << "Recommends: " << debian_pkg_rec << "\n";
      }
    if(debian_pkg_sug && *debian_pkg_sug)
      {
      out << "Suggests: " << debian_pkg_sug << "\n";
      }
    if(debian_pkg_url && *debian_pkg_url)
      {
      out << "Homepage: " << debian_pkg_url << "\n";
      }
    if (debian_pkg_predep && *debian_pkg_predep)
      {
      out << "Pre-Depends: " << debian_pkg_predep << "\n";
      }
    if (debian_pkg_enhances && *debian_pkg_enhances)
      {
      out << "Enhances: " << debian_pkg_enhances << "\n";
      }
    if (debian_pkg_breaks && *debian_pkg_breaks)
      {
      out << "Breaks: " << debian_pkg_breaks << "\n";
      }
    if (debian_pkg_conflicts && *debian_pkg_conflicts)
      {
      out << "Conflicts: " << debian_pkg_conflicts << "\n";
      }
    if (debian_pkg_provides && *debian_pkg_provides)
      {
      out << "Provides: " << debian_pkg_provides << "\n";
      }
    if (debian_pkg_replaces && *debian_pkg_replaces)
      {
      out << "Replaces: " << debian_pkg_replaces << "\n";
      }
    unsigned long totalSize = 0;
    {
      std::string dirName = this->GetOption("CPACK_TEMPORARY_DIRECTORY");
      dirName += '/';
        for (std::vector<std::string>::const_iterator fileIt =
              packageFiles.begin();
              fileIt != packageFiles.end(); ++ fileIt )
        {
        totalSize += cmSystemTools::FileLength(*fileIt);
        }
    }
    out << "Installed-Size: " << (totalSize + 1023) / 1024 << "\n";
    out << "Maintainer: " << maintainer << "\n";
    out << "Description: " << desc << "\n";
    out << std::endl;
    }

  std::string cmd(this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE"));

  const char* debian_compression_type =
      this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE");
  if(!debian_compression_type)
    {
    debian_compression_type = "gzip";
    }

  std::string cmake_tar = " ", compression_modifier = "a", compression_suffix;
  if(!strcmp(debian_compression_type, "lzma")) {
      compression_suffix = ".lzma";
  } else if(!strcmp(debian_compression_type, "xz")) {
      compression_suffix = ".xz";
  } else if(!strcmp(debian_compression_type, "bzip2")) {
      compression_suffix = ".bz2";
      compression_modifier = "j";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "gzip")) {
      compression_suffix = ".gz";
      compression_modifier = "z";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "none")) {
      compression_suffix = "";
      compression_modifier = "";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error unrecognized compression type: "
                    << debian_compression_type << std::endl);
  }

  cmd += cmake_tar + "tar c" + compression_modifier + "f data.tar"
      + compression_suffix;

  // now add all directories which have to be compressed
  // collect all top level install dirs for that
  // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would give /usr and /opt
    size_t topLevelLength = std::string(this->GetOption("GEN_WDIR")).length();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "WDIR: \""
          << this->GetOption("GEN_WDIR")
          << "\", length = " << topLevelLength
          << std::endl);
  std::set<std::string> installDirs;
    for (std::vector<std::string>::const_iterator fileIt =
        packageFiles.begin();
        fileIt != packageFiles.end(); ++ fileIt )
    {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "FILEIT: \"" << *fileIt << "\""
          << std::endl);
    std::string::size_type slashPos = fileIt->find('/', topLevelLength+1);
    std::string relativeDir = fileIt->substr(topLevelLength,
                                             slashPos - topLevelLength);
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "RELATIVEDIR: \"" << relativeDir
      << "\"" << std::endl);
    if (installDirs.find(relativeDir) == installDirs.end())
      {
      installDirs.insert(relativeDir);
      cmd += " .";
      cmd += relativeDir;
      }
    }

  std::string output;
    int retval = -1;
  int res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  std::string md5filename;
    md5filename = this->GetOption("GEN_WDIR");
  md5filename += "/md5sums";

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(md5filename.c_str());
    std::vector<std::string>::const_iterator fileIt;
//       std::string topLevelWithTrailingSlash = toplevel;
    std::string topLevelWithTrailingSlash =
        this->GetOption("CPACK_TEMPORARY_DIRECTORY");
    topLevelWithTrailingSlash += '/';
      for ( fileIt = packageFiles.begin();
            fileIt != packageFiles.end(); ++ fileIt )
      {
      cmd = "\"";
      cmd += cmSystemTools::GetCMakeCommand();
      cmd += "\" -E md5sum \"";
      cmd += *fileIt;
      cmd += "\"";
      //std::string output;
      //int retVal = -1;
      res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
          &retval, toplevel.c_str(), this->GeneratorVerbose, 0);
      if ( !res || retval )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running cmake -E md5sum "
                      << cmd << std::endl);
        }
      // debian md5sums entries are like this:
      // 014f3604694729f3bf19263bac599765  usr/bin/ccmake
      // thus strip the full path (with the trailing slash)
      cmSystemTools::ReplaceString(output,
                                   topLevelWithTrailingSlash.c_str(), "");
      out << output;
      }
    // each line contains a eol.
    // Do not end the md5sum file with yet another (invalid)
    }

    // set md5sum file permissins to RW-R--R-- so that deb lintian doesn't warn
    // about it
    cmSystemTools::SetPermissions(md5filename.c_str(),
        S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);

    cmd = this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE");
    cmd += cmake_tar + "tar czf control.tar.gz ./control ./md5sums";
    const char* controlExtra =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA");
  if( controlExtra )
    {
    std::vector<std::string> controlExtraList;
    cmSystemTools::ExpandListArgument(controlExtra, controlExtraList);
    for(std::vector<std::string>::iterator i =
          controlExtraList.begin(); i != controlExtraList.end(); ++i)
      {
      std::string filenamename =
        cmsys::SystemTools::GetFilenameName(*i);
      std::string localcopy = this->GetOption("GEN_WDIR");
      localcopy += "/";
      localcopy += filenamename;
      // if we can copy the file, it means it does exist, let's add it:
      if( cmsys::SystemTools::CopyFileIfDifferent(
            *i, localcopy) )
        {
        // debian is picky and need relative to ./ path in the tar.*
        cmd += " ./";
        cmd += filenamename;
        }
      }
    }
  res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  // ar -r your-package-name.deb debian-binary control.tar.* data.tar.*
  // since debian packages require BSD ar (most Linux distros and even
  // FreeBSD and NetBSD ship GNU ar) we use a copy of OpenBSD ar here.
  std::vector<std::string> arFiles;
    std::string topLevelString = this->GetOption("GEN_WDIR");
  topLevelString += "/";
  arFiles.push_back(topLevelString + "debian-binary");
  arFiles.push_back(topLevelString + "control.tar.gz");
  arFiles.push_back(topLevelString + "data.tar" + compression_suffix);
    std::string outputFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    outputFileName += "/";
    outputFileName += this->GetOption("CPACK_OUTPUT_FILE_NAME");
    res = ar_append(outputFileName.c_str(), arFiles);
  if ( res!=0 )
    {
    std::string tmpFile = this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Problem creating archive using: " << res << std::endl;
    return 0;
    }
  return 1;
}